

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<QTlsPrivate::X509CertificateBase::X509CertificateExtension*,long_long>
               (X509CertificateExtension *first,longlong n,X509CertificateExtension *d_first)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int *piVar4;
  PrivateShared *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  X509CertificateExtension *pXVar8;
  long lVar9;
  bool bVar10;
  QVariant *this;
  X509CertificateExtension *pXVar11;
  X509CertificateExtension *pXVar12;
  long in_FS_OFFSET;
  Destructor local_58;
  X509CertificateExtension *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  pXVar12 = d_first + n;
  pXVar11 = first;
  pXVar8 = pXVar12;
  if (first < pXVar12) {
    pXVar11 = pXVar12;
    pXVar8 = first;
  }
  local_38 = d_first;
  if (d_first != pXVar8) {
    do {
      pDVar1 = (first->oid).d.d;
      (first->oid).d.d = (Data *)0x0;
      (local_38->oid).d.d = pDVar1;
      pcVar2 = (first->oid).d.ptr;
      (first->oid).d.ptr = (char16_t *)0x0;
      (local_38->oid).d.ptr = pcVar2;
      qVar3 = (first->oid).d.size;
      (first->oid).d.size = 0;
      (local_38->oid).d.size = qVar3;
      pDVar1 = (first->name).d.d;
      (first->name).d.d = (Data *)0x0;
      (local_38->name).d.d = pDVar1;
      pcVar2 = (first->name).d.ptr;
      (first->name).d.ptr = (char16_t *)0x0;
      (local_38->name).d.ptr = pcVar2;
      qVar3 = (first->name).d.size;
      (first->name).d.size = 0;
      (local_38->name).d.size = qVar3;
      pPVar5 = (first->value).d.data.shared;
      uVar6 = *(undefined8 *)((long)&(first->value).d.data + 8);
      uVar7 = *(undefined8 *)&(first->value).d.field_0x18;
      *(undefined8 *)((long)&(local_38->value).d.data + 0x10) =
           *(undefined8 *)((long)&(first->value).d.data + 0x10);
      *(undefined8 *)&(local_38->value).d.field_0x18 = uVar7;
      (local_38->value).d.data.shared = pPVar5;
      *(undefined8 *)((long)&(local_38->value).d.data + 8) = uVar6;
      (first->value).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(first->value).d.data + 8) = 0;
      *(undefined8 *)((long)&(first->value).d.data + 0x10) = 0;
      *(undefined8 *)&(first->value).d.field_0x18 = 2;
      bVar10 = first->supported;
      local_38->critical = first->critical;
      local_38->supported = bVar10;
      local_38 = local_38 + 1;
      first = first + 1;
    } while (local_38 != pXVar8);
  }
  local_58.intermediate = local_38;
  local_58.end = d_first;
  for (; pXVar8 = local_38, local_38 != pXVar12; local_38 = local_38 + 1) {
    pDVar1 = (local_38->oid).d.d;
    (local_38->oid).d.d = (first->oid).d.d;
    (first->oid).d.d = pDVar1;
    pcVar2 = (local_38->oid).d.ptr;
    (local_38->oid).d.ptr = (first->oid).d.ptr;
    (first->oid).d.ptr = pcVar2;
    qVar3 = (local_38->oid).d.size;
    (local_38->oid).d.size = (first->oid).d.size;
    (first->oid).d.size = qVar3;
    pDVar1 = (local_38->name).d.d;
    (local_38->name).d.d = (first->name).d.d;
    (first->name).d.d = pDVar1;
    pcVar2 = (local_38->name).d.ptr;
    (local_38->name).d.ptr = (first->name).d.ptr;
    (first->name).d.ptr = pcVar2;
    qVar3 = (local_38->name).d.size;
    (local_38->name).d.size = (first->name).d.size;
    (first->name).d.size = qVar3;
    QVariant::operator=(&local_38->value,&first->value);
    bVar10 = first->supported;
    pXVar8->critical = first->critical;
    pXVar8->supported = bVar10;
    first = first + 1;
  }
  local_58.iter = &local_58.end;
  if (first != pXVar11) {
    this = &first[-1].value;
    do {
      QVariant::~QVariant(this);
      piVar4 = *(int **)((long)(this + -1) + 8);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)(this + -1) + 8),2,0x10);
        }
      }
      piVar4 = *(int **)((long)(this + -2) + 0x10);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)(this + -2) + 0x10),2,0x10);
        }
      }
      lVar9 = (long)(this + -2);
      this = (QVariant *)((long)(this + -3) + 8);
    } while ((X509CertificateExtension *)(lVar9 + 0x10) != pXVar11);
  }
  q_relocate_overlap_n_left_move<QTlsPrivate::X509CertificateBase::X509CertificateExtension_*,_long_long>
  ::Destructor::~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}